

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,undefined8 branchIndex,
          NoInfer<kj::ArrayPtr<const_char>_> *first,NoInfer<kj::CappedArray<char,_14UL>_> *rest,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_1,NoInfer<kj::StringTree> *rest_2,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_3,NoInfer<kj::String> *rest_4,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_5,NoInfer<kj::ArrayPtr<const_char>_> *rest_6,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_7,NoInfer<kj::ArrayPtr<const_char>_> *rest_8,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_9,NoInfer<kj::ArrayPtr<const_char>_> *rest_10,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_11,NoInfer<kj::String> *rest_12,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_13,NoInfer<kj::CappedArray<char,_14UL>_> *rest_14
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_15,NoInfer<kj::StringTree> *rest_16,
          NoInfer<kj::StringTree> *rest_17,NoInfer<kj::ArrayPtr<const_char>_> *rest_18,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_19,NoInfer<kj::ArrayPtr<const_char>_> *rest_20,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_21,NoInfer<kj::ArrayPtr<const_char>_> *rest_22,
          NoInfer<kj::String> *rest_23,NoInfer<kj::ArrayPtr<const_char>_> *rest_24,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_25,NoInfer<kj::ArrayPtr<const_char>_> *rest_26,
          NoInfer<kj::String> *rest_27,NoInfer<kj::ArrayPtr<const_char>_> *rest_28,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_29,NoInfer<kj::ArrayPtr<const_char>_> *rest_30
          ,NoInfer<kj::StringTree> *rest_31,NoInfer<kj::ArrayPtr<const_char>_> *rest_32,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_33,NoInfer<kj::ArrayPtr<const_char>_> *rest_34,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_35,NoInfer<kj::ArrayPtr<const_char>_> *rest_36,
          NoInfer<kj::String> *rest_37,NoInfer<kj::ArrayPtr<const_char>_> *rest_38,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_39,NoInfer<kj::ArrayPtr<const_char>_> *rest_40,
          NoInfer<kj::String> *rest_41,NoInfer<kj::ArrayPtr<const_char>_> *rest_42,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_43,NoInfer<kj::ArrayPtr<const_char>_> *rest_44
          ,NoInfer<kj::StringTree> *rest_45,NoInfer<kj::ArrayPtr<const_char>_> *rest_46,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_47,NoInfer<kj::ArrayPtr<const_char>_> *rest_48,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_49,NoInfer<kj::ArrayPtr<const_char>_> *rest_50,
          NoInfer<kj::String> *rest_51,NoInfer<kj::ArrayPtr<const_char>_> *rest_52,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_53,NoInfer<kj::ArrayPtr<const_char>_> *rest_54,
          NoInfer<kj::String> *rest_55,NoInfer<kj::ArrayPtr<const_char>_> *rest_56,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_57,NoInfer<kj::ArrayPtr<const_char>_> *rest_58
          ,NoInfer<kj::StringTree> *rest_59,NoInfer<kj::ArrayPtr<const_char>_> *rest_60,
          NoInfer<kj::String> *rest_61,NoInfer<kj::ArrayPtr<const_char>_> *rest_62,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_63)

{
  ArrayPtr<const_char> *pAVar1;
  char *pcVar2;
  CappedArray<char,_14UL> *pCVar3;
  StringTree *pSVar4;
  ArrayPtr<const_char> *pAVar5;
  String *pSVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  ArrayPtr<const_char> *pAVar11;
  ArrayPtr<const_char> *pAVar12;
  ArrayPtr<const_char> *pAVar13;
  String *pSVar14;
  ArrayPtr<const_char> *pAVar15;
  CappedArray<char,_14UL> *pCVar16;
  ArrayPtr<const_char> *pAVar17;
  StringTree *pSVar18;
  StringTree *pSVar19;
  ArrayPtr<const_char> *pAVar20;
  ArrayPtr<const_char> *pAVar21;
  ArrayPtr<const_char> *pAVar22;
  ArrayPtr<const_char> *pAVar23;
  ArrayPtr<const_char> *pAVar24;
  String *pSVar25;
  ArrayPtr<const_char> *pAVar26;
  ArrayPtr<const_char> *pAVar27;
  ArrayPtr<const_char> *pAVar28;
  String *pSVar29;
  ArrayPtr<const_char> *pAVar30;
  CappedArray<char,_14UL> *pCVar31;
  ArrayPtr<const_char> *pAVar32;
  StringTree *pSVar33;
  ArrayPtr<const_char> *pAVar34;
  ArrayPtr<const_char> *pAVar35;
  ArrayPtr<const_char> *pAVar36;
  ArrayPtr<const_char> *pAVar37;
  ArrayPtr<const_char> *pAVar38;
  String *pSVar39;
  ArrayPtr<const_char> *pAVar40;
  ArrayPtr<const_char> *pAVar41;
  ArrayPtr<const_char> *pAVar42;
  String *pSVar43;
  ArrayPtr<const_char> *pAVar44;
  CappedArray<char,_14UL> *pCVar45;
  ArrayPtr<const_char> *pAVar46;
  StringTree *pSVar47;
  ArrayPtr<const_char> *pAVar48;
  ArrayPtr<const_char> *pAVar49;
  ArrayPtr<const_char> *pAVar50;
  ArrayPtr<const_char> *pAVar51;
  ArrayPtr<const_char> *pAVar52;
  String *pSVar53;
  ArrayPtr<const_char> *pAVar54;
  ArrayPtr<const_char> *pAVar55;
  ArrayPtr<const_char> *pAVar56;
  String *pSVar57;
  ArrayPtr<const_char> *pAVar58;
  CappedArray<char,_14UL> *pCVar59;
  ArrayPtr<const_char> *pAVar60;
  StringTree *pSVar61;
  ArrayPtr<const_char> *pAVar62;
  String *pSVar63;
  ArrayPtr<const_char> *pAVar64;
  ArrayPtr<const_char> *pAVar65;
  ArrayPtr<const_char> *pAVar66;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000001f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000200;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000208;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000210;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000218;
  NoInfer<kj::String> *in_stack_00000220;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000228;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000230;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000238;
  ArrayPtr<const_char> *rest_local_1;
  CappedArray<char,_14UL> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pcVar2 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  pCVar3 = fwd<kj::CappedArray<char,14ul>>(rest);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  pSVar4 = fwd<kj::StringTree>(rest_2);
  pAVar5 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pSVar6 = fwd<kj::String>(rest_4);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  pAVar11 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  pAVar12 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  pAVar13 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  pSVar14 = fwd<kj::String>(rest_12);
  pAVar15 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pCVar16 = fwd<kj::CappedArray<char,14ul>>(rest_14);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pSVar18 = fwd<kj::StringTree>(rest_16);
  pSVar19 = fwd<kj::StringTree>(rest_17);
  pAVar20 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  pAVar21 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  pAVar22 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  pAVar23 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  pAVar24 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  pSVar25 = fwd<kj::String>(rest_23);
  pAVar26 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  pAVar27 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  pAVar28 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  pSVar29 = fwd<kj::String>(rest_27);
  pAVar30 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  pCVar31 = fwd<kj::CappedArray<char,14ul>>(rest_29);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pSVar33 = fwd<kj::StringTree>(rest_31);
  pAVar34 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  pAVar35 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  pAVar36 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  pAVar37 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  pAVar38 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  pSVar39 = fwd<kj::String>(rest_37);
  pAVar40 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  pAVar41 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pAVar42 = fwd<kj::ArrayPtr<char_const>>(rest_40);
  pSVar43 = fwd<kj::String>(rest_41);
  pAVar44 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  pCVar45 = fwd<kj::CappedArray<char,14ul>>(rest_43);
  pAVar46 = fwd<kj::ArrayPtr<char_const>>(rest_44);
  pSVar47 = fwd<kj::StringTree>(rest_45);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_46);
  pAVar49 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  pAVar50 = fwd<kj::ArrayPtr<char_const>>(rest_48);
  pAVar51 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  pAVar52 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  pSVar53 = fwd<kj::String>(rest_51);
  pAVar54 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  pAVar55 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_54);
  pSVar57 = fwd<kj::String>(rest_55);
  pAVar58 = fwd<kj::ArrayPtr<char_const>>(rest_56);
  pCVar59 = fwd<kj::CappedArray<char,14ul>>(rest_57);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_58);
  pSVar61 = fwd<kj::StringTree>(rest_59);
  pAVar62 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  pSVar63 = fwd<kj::String>(rest_61);
  pAVar64 = fwd<kj::ArrayPtr<char_const>>(rest_62);
  pAVar65 = fwd<kj::ArrayPtr<char_const>>(rest_63);
  pAVar66 = fwd<kj::ArrayPtr<char_const>>(in_stack_000001f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000208);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000210);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000218);
  fwd<kj::String>(in_stack_00000220);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000230);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pcVar2,branchIndex,pCVar3,pAVar1,pSVar4,pAVar5,pSVar6,pAVar7,pAVar8,pAVar9,pAVar10
             ,pAVar11,pAVar12,pAVar13,pSVar14,pAVar15,pCVar16,pAVar17,pSVar18,pSVar19,pAVar20,
             pAVar21,pAVar22,pAVar23,pAVar24,pSVar25,pAVar26,pAVar27,pAVar28,pSVar29,pAVar30,pCVar31
             ,pAVar32,pSVar33,pAVar34,pAVar35,pAVar36,pAVar37,pAVar38,pSVar39,pAVar40,pAVar41,
             pAVar42,pSVar43,pAVar44,pCVar45,pAVar46,pSVar47,pAVar48,pAVar49,pAVar50,pAVar51,pAVar52
             ,pSVar53,pAVar54,pAVar55,pAVar56,pSVar57,pAVar58,pCVar59,pAVar60,pSVar61,pAVar62,
             pSVar63,pAVar64,pAVar65,pAVar66);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}